

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DMSymbolInfo.cpp
# Opt level: O0

int __thiscall ZXing::DataMatrix::SymbolInfo::horizontalDataRegions(SymbolInfo *this)

{
  out_of_range *this_00;
  long in_RDI;
  int local_4;
  
  switch(*(undefined4 *)(in_RDI + 0x14)) {
  case 1:
    local_4 = 1;
    break;
  case 2:
    local_4 = 2;
    break;
  default:
    this_00 = (out_of_range *)__cxa_allocate_exception(0x10);
    std::out_of_range::out_of_range(this_00,"Cannot handle this number of data regions");
    __cxa_throw(this_00,&std::out_of_range::typeinfo,std::out_of_range::~out_of_range);
  case 4:
    local_4 = 2;
    break;
  case 0x10:
    local_4 = 4;
    break;
  case 0x24:
    local_4 = 6;
  }
  return local_4;
}

Assistant:

int
SymbolInfo::horizontalDataRegions() const
{
	switch (_dataRegions) {
	case 1:  return 1;
	case 2:  return 2;
	case 4:  return 2;
	case 16: return 4;
	case 36: return 6;
	default: throw std::out_of_range("Cannot handle this number of data regions");
	}
}